

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void test(int argc,char **argv)

{
  char cVar1;
  int k;
  int iVar2;
  string infile;
  FastText fasttext;
  ifstream ifs;
  allocator aaStack_298 [32];
  undefined1 local_278 [32];
  __shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> _Stack_258;
  __shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> local_248;
  __shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> _Stack_238;
  string local_218 [16];
  
  if (argc == 4) {
    k = 1;
  }
  else {
    if (argc != 5) {
      printTestUsage();
      goto LAB_0011bb80;
    }
    k = atoi(argv[4]);
  }
  _Stack_258 = (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x40);
  _Stack_238._M_ptr = (element_type *)0x0;
  _Stack_238._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_248._M_ptr = (element_type *)0x0;
  local_248._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_278 = ZEXT1632((undefined1  [16])_Stack_258);
  std::__cxx11::string::string((string *)local_218,argv[2],aaStack_298);
  ::fasttext::FastText::loadModel((FastText *)local_278,local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218[0]._M_dataplus._M_p != &local_218[0].field_2) {
    operator_delete(local_218[0]._M_dataplus._M_p);
  }
  std::__cxx11::string::string((string *)aaStack_298,argv[3],(allocator *)local_218);
  iVar2 = std::__cxx11::string::compare((char *)aaStack_298);
  if (iVar2 == 0) {
    ::fasttext::FastText::test((FastText *)local_278,(istream *)&std::cin,k);
  }
  else {
    std::ifstream::ifstream(local_218,(string *)aaStack_298,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Test file cannot be opened!",0x1b);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_0011bb80:
      exit(1);
    }
    ::fasttext::FastText::test((FastText *)local_278,(istream *)local_218,k);
    std::ifstream::close();
    std::ifstream::~ifstream(local_218);
  }
  exit(0);
}

Assistant:

void test(int argc, char** argv) {
  int32_t k;
  if (argc == 4) {
    k = 1;
  } else if (argc == 5) {
    k = atoi(argv[4]);
  } else {
    printTestUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(argv[2]));
  std::string infile(argv[3]);
  if (infile == "-") {
    fasttext.test(std::cin, k);
  } else {
    std::ifstream ifs(infile);
    if (!ifs.is_open()) {
      std::cerr << "Test file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
    fasttext.test(ifs, k);
    ifs.close();
  }
  exit(0);
}